

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseData.cpp
# Opt level: O0

bool __thiscall
SGParser::Generator::StdGrammarParseData::BuildParser
          (StdGrammarParseData *this,InputStream *pinitStr)

{
  Lex **this_00;
  pointer *this_01;
  pointer *this_02;
  bool bVar1;
  uint uVar2;
  ParseMessageBuffer *pPVar3;
  vector<SGParser::Generator::ParseMessage,_std::allocator<SGParser::Generator::ParseMessage>_>
  *pvVar4;
  GrammarDebugData *pGVar5;
  undefined1 local_7c8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> startSymbols;
  vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
  productions;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  grammarSymbols;
  undefined1 local_760 [3];
  bool result;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  grammarSymbolVC;
  vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
  productionVC;
  StdGrammarParseHandler sgParseHandler;
  Grammar sgGrammar;
  undefined1 local_418 [8];
  Parse<SGParser::Generator::StdGrammarStackElement> sgParser;
  DFATokenizer<SGParser::Generator::StdGrammarToken> sgTokenizer;
  Lex sgLex;
  InputStream *pinitStr_local;
  StdGrammarParseData *this_local;
  
  sgLex.Messages.pMessages = (Messages *)pinitStr;
  Lex::Lex((Lex *)&sgTokenizer.ExpressionStack.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  DFATokenizer<SGParser::Generator::StdGrammarToken>::DFATokenizer
            ((DFATokenizer<SGParser::Generator::StdGrammarToken> *)
             ((long)&sgParser.ErrorStackStr.field_2 + 8));
  Parse<SGParser::Generator::StdGrammarStackElement>::Parse
            ((Parse<SGParser::Generator::StdGrammarStackElement> *)local_418,(ParseTable *)0x0,0x800
            );
  Grammar::Grammar((Grammar *)&sgParseHandler.pLex);
  StdGrammarParseHandler::StdGrammarParseHandler
            ((StdGrammarParseHandler *)
             &productionVC.
              super__Vector_base<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>::
  vector((vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
          *)&grammarSymbolVC._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         *)local_760);
  bVar1 = DFA::IsValid(&(this->StdGrammarDFA).super_DFA);
  if (!bVar1) {
    CreateLexemes(this,(vector<SGParser::Lexeme,_std::allocator<SGParser::Lexeme>_> *)
                       &sgLex.MacroNames.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar1 = Lex::MakeDFA((Lex *)&sgTokenizer.ExpressionStack.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,
                         &this->StdGrammarDFA,NFA);
    if (!bVar1) {
      this_local._7_1_ = false;
      goto LAB_00170bf2;
    }
  }
  bVar1 = ParseTable::IsValid(&(this->StdGrammarParseTable).super_ParseTable);
  if (!bVar1) {
    CreateVectors(this,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                        *)local_760,
                  (vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
                   *)&grammarSymbolVC._M_t._M_impl.super__Rb_tree_header._M_node_count);
    Grammar::Create((Grammar *)&sgParseHandler.pLex,
                    (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     *)local_760,
                    (vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
                     *)&grammarSymbolVC._M_t._M_impl.super__Rb_tree_header._M_node_count);
    this_00 = &sgParseHandler.pLex;
    pPVar3 = Grammar::GetMessageBuffer((Grammar *)this_00);
    pvVar4 = ParseMessageBuffer::GetMessageBuffer(&this->Messages);
    uVar2 = ParseMessageBuffer::GetMessageFlags(&this->Messages);
    ParseMessageBuffer::SetMessageBuffer(pPVar3,pvVar4,uVar2);
    pGVar5 = Grammar::GetDebugData((Grammar *)this_00);
    *(byte *)&pGVar5->Flags = (byte)pGVar5->Flags | 1;
    bVar1 = ParseTableGen::Create(&this->StdGrammarParseTable,(Grammar *)this_00,CLR);
    if (!bVar1) {
      this_local._7_1_ = false;
      goto LAB_00170bf2;
    }
  }
  bVar1 = Parse<SGParser::Generator::StdGrammarStackElement>::Create
                    ((Parse<SGParser::Generator::StdGrammarStackElement> *)local_418,
                     &(this->StdGrammarParseTable).super_ParseTable,0x800);
  if (bVar1) {
    bVar1 = DFATokenizer<SGParser::Generator::StdGrammarToken>::Create
                      ((DFATokenizer<SGParser::Generator::StdGrammarToken> *)
                       ((long)&sgParser.ErrorStackStr.field_2 + 8),&(this->StdGrammarDFA).super_DFA,
                       (InputStream *)sgLex.Messages.pMessages);
    if (bVar1) {
      Parse<SGParser::Generator::StdGrammarStackElement>::SetTokenStream
                ((Parse<SGParser::Generator::StdGrammarStackElement> *)local_418,
                 (TokenStream<SGParser::Generator::StdGrammarToken> *)
                 ((long)&sgParser.ErrorStackStr.field_2 + 8));
      sgParseHandler.Productions.
      super__Vector_base<SGParser::Generator::StdGrammarParseHandler::ProductionData,_std::allocator<SGParser::Generator::StdGrammarParseHandler::ProductionData>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&this->UserLex;
      pvVar4 = ParseMessageBuffer::GetMessageBuffer(&this->Messages);
      uVar2 = ParseMessageBuffer::GetMessageFlags(&this->Messages);
      ParseMessageBuffer::SetMessageBuffer((ParseMessageBuffer *)&sgParseHandler,pvVar4,uVar2);
      bVar1 = Parse<SGParser::Generator::StdGrammarStackElement>::DoParse
                        ((Parse<SGParser::Generator::StdGrammarStackElement> *)local_418,
                         (ParseHandler<SGParser::Generator::StdGrammarStackElement> *)
                         &productionVC.
                          super__Vector_base<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if ((bVar1) && (sgParseHandler.Messages.pMessages == (Messages *)0x0)) {
        Lex::ConvertActionParam(&this->UserLex);
        this_01 = &productions.
                   super__Vector_base<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               *)this_01);
        this_02 = &startSymbols.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::
        vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>::
        vector((vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
                *)this_02);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_7c8);
        this_local._7_1_ =
             CreateSymbolMap(this,(StdGrammarParseHandler *)
                                  &productionVC.
                                   super__Vector_base<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                              *)this_01,
                             (vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
                              *)this_02,
                             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_7c8);
        if (this_local._7_1_) {
          Grammar::Clear(&this->UserGrammar);
          pPVar3 = Grammar::GetMessageBuffer(&this->UserGrammar);
          pvVar4 = ParseMessageBuffer::GetMessageBuffer(&this->Messages);
          uVar2 = ParseMessageBuffer::GetMessageFlags(&this->Messages);
          ParseMessageBuffer::SetMessageBuffer(pPVar3,pvVar4,uVar2);
          Grammar::SetPrecedence(&this->UserGrammar,&(this->UserLex).Precedence);
          Grammar::SetStartSymbols
                    (&this->UserGrammar,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_7c8);
          Grammar::AddGrammarSymbols
                    (&this->UserGrammar,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      *)&productions.
                         super__Vector_base<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
          Grammar::AddProductions
                    (&this->UserGrammar,
                     (vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
                      *)&startSymbols.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
        }
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_7c8);
        std::
        vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>::
        ~vector((vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
                 *)&startSymbols.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
        ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                *)&productions.
                   super__Vector_base<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
LAB_00170bf2:
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          *)local_760);
  std::vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>::
  ~vector((vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
           *)&grammarSymbolVC._M_t._M_impl.super__Rb_tree_header._M_node_count);
  StdGrammarParseHandler::~StdGrammarParseHandler
            ((StdGrammarParseHandler *)
             &productionVC.
              super__Vector_base<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Grammar::~Grammar((Grammar *)&sgParseHandler.pLex);
  Parse<SGParser::Generator::StdGrammarStackElement>::~Parse
            ((Parse<SGParser::Generator::StdGrammarStackElement> *)local_418);
  DFATokenizer<SGParser::Generator::StdGrammarToken>::~DFATokenizer
            ((DFATokenizer<SGParser::Generator::StdGrammarToken> *)
             ((long)&sgParser.ErrorStackStr.field_2 + 8));
  Lex::~Lex((Lex *)&sgTokenizer.ExpressionStack.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  return this_local._7_1_;
}

Assistant:

bool StdGrammarParseData::BuildParser(InputStream* pinitStr) {
    // *** Internal Standard Grammar parser data

    Lex                           sgLex;
    DFATokenizer<StdGrammarToken> sgTokenizer;
    Parse<StdGrammarStackElement> sgParser;
    Grammar                       sgGrammar;
    StdGrammarParseHandler        sgParseHandler;

    std::vector<Production>       productionVC;
    std::map<String, unsigned>    grammarSymbolVC;

    // *** Load grammar

    if (!StdGrammarDFA.IsValid()) {
        // Setup the lexemes list with the hard-coded values
        CreateLexemes(sgLex.Lexemes);

        // Create a VPP DFA
        if (!sgLex.MakeDFA(StdGrammarDFA))
            return false;
    }

    if (!StdGrammarParseTable.IsValid()) {
        // Load the hard coded grammar... for the SG parser Standard Grammar file format
        CreateVectors(grammarSymbolVC, productionVC);

        // Create the grammar
        sgGrammar.Create(grammarSymbolVC, productionVC);

        // Create a parse table
        sgGrammar.GetMessageBuffer().SetMessageBuffer(Messages.GetMessageBuffer(),
                                                      Messages.GetMessageFlags());
        sgGrammar.GetDebugData().Flags |= GrammarDebugData::Canonical;

        if (!StdGrammarParseTable.Create(sgGrammar, ParseTableType::CLR))
            return false;
    }

    // *** Parse grammar

    // Create the parse class
    if (!sgParser.Create(&StdGrammarParseTable))
        return false;

    // Setup the tokenizer
    if (!sgTokenizer.Create(&StdGrammarDFA, pinitStr))
        return false;

    // Setup the parse class
    sgParser.SetTokenStream(&sgTokenizer);

    // Setup the parse handler
    sgParseHandler.pLex = &UserLex;
    sgParseHandler.Messages.SetMessageBuffer(Messages.GetMessageBuffer(),
                                             Messages.GetMessageFlags());

    // Parse the grammar
    const auto result = sgParser.DoParse(sgParseHandler);

    // Errors were encountered while parsing the command line input
    if (!result || sgParseHandler.ErrorCount > 0u)
        return false;

    // Converts action parameters into numbers
    UserLex.ConvertActionParam();

    std::map<String, unsigned> grammarSymbols;
    std::vector<Production>    productions;
    std::vector<unsigned>      startSymbols;

    // Create the grammar symbol map and production array from the productions data
    if (!CreateSymbolMap(sgParseHandler, grammarSymbols, productions, startSymbols))
        return false;

    UserGrammar.Clear();

    // Setup grammar debug and buffer
    UserGrammar.GetMessageBuffer().SetMessageBuffer(Messages.GetMessageBuffer(),
                                                    Messages.GetMessageFlags());

    // Now 'grammarSymbols' and 'productions' contain the
    // information needed to make the parser and tokenizer
    UserGrammar.SetPrecedence(UserLex.Precedence);
    UserGrammar.SetStartSymbols(startSymbols);

    UserGrammar.AddGrammarSymbols(grammarSymbols);
    UserGrammar.AddProductions(productions);

    return true;
}